

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineoption.cpp
# Opt level: O1

result_type __thiscall
anon_unknown.dwarf_5cf486::IsInvalidName::operator()(IsInvalidName *this,QString *name)

{
  qsizetype qVar1;
  result_type rVar2;
  long in_FS_OFFSET;
  QStringView local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  rVar2 = true;
  if ((*(long *)(this + 0x10) != 0) &&
     ((storage_type_conflict)(**(storage_type_conflict **)(this + 8) | 2U) != 0x2f)) {
    rVar2 = false;
    local_20.m_data = *(storage_type_conflict **)(this + 8);
    local_20.m_size = *(long *)(this + 0x10);
    qVar1 = QStringView::indexOf(&local_20,(QChar)0x3d,0,CaseSensitive);
    if (qVar1 != -1) {
      rVar2 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return rVar2;
  }
  __stack_chk_fail();
}

Assistant:

operator()(const QString &name) const noexcept
        {
            if (Q_UNLIKELY(name.isEmpty()))
                return warn("be empty");

            const QChar c = name.at(0);
            if (Q_UNLIKELY(c == u'-'))
                return warn("start with a '-'");
            if (Q_UNLIKELY(c == u'/'))
                return warn("start with a '/'");
            if (Q_UNLIKELY(name.contains(u'=')))
                return warn("contain a '='");

            return false;
        }